

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O1

AssertionResult * __thiscall
iuutil::StrInHelper::Assertion<char[100],std::__cxx11::string>
          (AssertionResult *__return_storage_ptr__,StrInHelper *this,char *substr_str,
          char *actual_str,char (*substr) [100],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  AssertionResult *pAVar4;
  bool bVar5;
  char *local_58;
  StrInHelper *local_50;
  AssertionResult local_48;
  
  local_58 = substr_str;
  local_50 = this;
  if (*(char **)*substr == (char *)0x0) {
    bVar5 = actual_str == (char *)0x0;
  }
  else {
    pcVar3 = strstr(*(char **)*substr,actual_str);
    bVar5 = pcVar3 != (char *)0x0;
  }
  if (bVar5) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    paVar1 = &local_48.m_message.field_2;
    local_48.m_message._M_string_length = 0;
    local_48.m_message.field_2._M_local_buf[0] = '\0';
    local_48.m_result = false;
    local_48.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar4 = iutest::AssertionResult::operator<<(&local_48,(char (*) [18])"error: Expected: ");
    pAVar4 = iutest::AssertionResult::operator<<(pAVar4,(char (*) [8])"strstr(");
    pAVar4 = iutest::AssertionResult::operator<<(pAVar4,&local_58);
    pAVar4 = iutest::AssertionResult::operator<<(pAVar4,(char (*) [3])0x128a4b);
    pAVar4 = iutest::AssertionResult::operator<<(pAVar4,(char **)&local_50);
    pAVar4 = iutest::AssertionResult::operator<<(pAVar4,(char (*) [10])") != NULL");
    pAVar4 = iutest::AssertionResult::operator<<(pAVar4,(char (*) [12])"\n  Actual: ");
    pAVar4 = iutest::AssertionResult::operator<<(pAVar4,(char (*) [9])"strstr(\"");
    pAVar4 = iutest::AssertionResult::operator<<
                       (pAVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               substr);
    pAVar4 = iutest::AssertionResult::operator<<(pAVar4,(char (*) [4])"\", ");
    pAVar4 = iutest::AssertionResult::operator<<(pAVar4,(char (*) [100])actual_str);
    pAVar4 = iutest::AssertionResult::operator<<(pAVar4,(char (*) [10])") == NULL");
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar2 = (pAVar4->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar4->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar4->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_48.m_message._M_dataplus._M_p,
                      CONCAT71(local_48.m_message.field_2._M_allocated_capacity._1_7_,
                               local_48.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ Assertion(const char* substr_str, const char* actual_str
    , const T1& substr, const T2& actual)
{
    if( Compare(substr, actual) )
    {
        return ::iutest::AssertionSuccess();
    }

    return ::iutest::AssertionFailure() << "error: Expected: " << "strstr(" << actual_str << ", " << substr_str << ") != NULL"
        << "\n  Actual: " << "strstr(\"" << actual << "\", " << substr << ") == NULL";
}